

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int match_lit(char **str,size_t *len,char *lit,size_t litlen,date_parse_string *capture)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  size_t sVar5;
  char *p;
  size_t matchlen;
  ulong local_38;
  
  if (lit == (char *)0x0) {
LAB_00258b88:
    iVar2 = 0;
  }
  else {
    if (litlen == 0) {
      bVar1 = false;
      litlen = 0;
    }
    else if (*lit == '^') {
      lit = lit + 1;
      litlen = litlen - 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      if (*len < litlen) {
        return 0;
      }
      iVar2 = bcmp(lit,*str,litlen);
      local_38 = litlen;
      if (iVar2 != 0) {
        return 0;
      }
    }
    else {
      iVar2 = t3_compare_case_fold(lit,litlen,*str,*len,&local_38);
      if (iVar2 != 0) goto LAB_00258b88;
    }
    p = *str + local_38;
    sVar5 = *len - local_38;
    if (litlen != 0 && sVar5 != 0) {
      wVar3 = utf8_ptr::s_getch_before(p,1);
      wVar4 = utf8_ptr::s_getch(p);
      iVar2 = isalpha(wVar3);
      if (((iVar2 != 0) && (iVar2 = isalpha(wVar4), iVar2 != 0)) ||
         ((uint)(wVar3 + L'\xffffffd0') < 10 && (uint)(wVar4 + L'\xffffffd0') < 10))
      goto LAB_00258b88;
    }
    capture->p = *str;
    capture->len = (long)p - (long)*str;
    *str = p;
    *len = sVar5;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int match_lit(const char *&str, size_t &len,
                     const char *lit, size_t litlen,
                     date_parse_string &capture)
{
    /* if there's no literal, there's no match */
    if (lit == 0)
        return 0;

    /* if the template starts with "^", it means do not fold case */
    int fold_case = TRUE;
    if (litlen != 0 && *lit == '^')
        fold_case = FALSE, ++lit, --litlen;

    /* try matching the template text */
    size_t matchlen;
    if (fold_case)
    {
        /* compare the leading substring of 'str' with case folding */
        if (t3_compare_case_fold(lit, litlen, str, len, &matchlen) != 0)
            return FALSE;
    }
    else if (len >= litlen)
    {
        /* compare exactly as given with no case folding */
        if (memcmp(lit, str, litlen) != 0)
            return FALSE;
        matchlen = litlen;
    }
    else
    {
        /* it's too short to match */
        return FALSE;
    }

    /* get a pointer to the next character after the end of the match */
    utf8_ptr p((char *)str + matchlen);
    size_t rem = len - matchlen;

    /* make sure we ended on a suitable boundary */
    if (rem != 0 && litlen != 0)
    {
        /* get the last character of the matched text */
        wchar_t last = p.getch_before(1);
        wchar_t next = p.getch();

        /* if we ended on alphabetic, make sure the next is non-alpha */
        if (isalpha(last) && isalpha(next))
            return FALSE;

        /* if we ended on a number, maek sure the next is non-numeric */
        if (isdigit(last) && isdigit(next))
            return FALSE;
    }
    
    /* set the capture data */
    capture.p = str;
    capture.len = p.getptr() - str;

    /* advance the caller's string pointers past the match */
    str = p.getptr();
    len = rem;

    /* return success */
    return TRUE;
}